

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.c++
# Opt level: O0

size_t capnp::computeSerializedSizeInWords
                 (ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments)

{
  bool bVar1;
  size_t sVar2;
  ArrayPtr<const_capnp::word> *pAVar3;
  ArrayPtr<const_capnp::word> *segment;
  ArrayPtr<const_capnp::word> *__end1;
  ArrayPtr<const_capnp::word> *__begin1;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *__range1;
  size_t totalSize;
  Fault local_60;
  Fault f;
  size_t local_50;
  DebugExpression<unsigned_long> local_48;
  undefined1 local_40 [8];
  DebugComparison<unsigned_long,_int> _kjCondition;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments_local;
  
  _kjCondition._32_8_ = segments.ptr;
  local_50 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                       ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&_kjCondition.result);
  local_48 = kj::_::DebugExpressionStart::operator<<
                       ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_50);
  f.exception._4_4_ = 0;
  kj::_::DebugExpression<unsigned_long>::operator>
            ((DebugComparison<unsigned_long,_int> *)local_40,&local_48,
             (int *)((long)&f.exception + 4));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_40);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[42]>
              (&local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/serialize.c++"
               ,0x9b,FAILED,"segments.size() > 0",
               "_kjCondition,\"Tried to serialize uninitialized message.\"",
               (DebugComparison<unsigned_long,_int> *)local_40,
               (char (*) [42])"Tried to serialize uninitialized message.");
    kj::_::Debug::Fault::fatal(&local_60);
  }
  sVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                    ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&_kjCondition.result);
  __range1 = (ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)((sVar2 >> 1) + 1);
  __end1 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::begin
                     ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&_kjCondition.result);
  pAVar3 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::end
                     ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&_kjCondition.result);
  for (; __end1 != pAVar3; __end1 = __end1 + 1) {
    sVar2 = kj::ArrayPtr<const_capnp::word>::size(__end1);
    __range1 = (ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)((long)&__range1->ptr + sVar2);
  }
  return (size_t)__range1;
}

Assistant:

size_t computeSerializedSizeInWords(kj::ArrayPtr<const kj::ArrayPtr<const word>> segments) {
  KJ_REQUIRE(segments.size() > 0, "Tried to serialize uninitialized message.");

  size_t totalSize = segments.size() / 2 + 1;

  for (auto& segment: segments) {
    totalSize += segment.size();
  }

  return totalSize;
}